

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::Property::~Property(Property *this)

{
  Property *this_local;
  
  cmDeleteAll<std::vector<cmCompiledGeneratorExpression*,std::allocator<cmCompiledGeneratorExpression*>>>
            (&this->ValueExpressions);
  std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
  ~vector(&this->ValueExpressions);
  return;
}

Assistant:

cmInstalledFile::Property::~Property()
{
  cmDeleteAll(this->ValueExpressions);
}